

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O3

void subBlock(treeNode *tn)

{
  pointer *ppptVar1;
  iterator iVar2;
  int iVar3;
  int iVar4;
  treeNode *ptVar5;
  long lVar6;
  treeNode *sen_BLOCKt;
  treeNode *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"jmp","");
  addCode(&local_48,0,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  lVar6 = (long)cx;
  iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
  if (iVar3 == 0) {
    ptVar5 = (treeNode *)operator_new(0x38);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,anon_var_dwarf_7c90,anon_var_dwarf_7c90 + 0x12);
    treeNode::treeNode(ptVar5,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f0 = ptVar5;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_f0);
    }
    else {
      *iVar2._M_current = ptVar5;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    const_BLOCK(local_f0);
  }
  iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
  iVar4 = 3;
  if (iVar3 == 0) {
    ptVar5 = (treeNode *)operator_new(0x38);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,anon_var_dwarf_7c9b,anon_var_dwarf_7c9b + 0x12);
    treeNode::treeNode(ptVar5,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f0 = ptVar5;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_f0);
    }
    else {
      *iVar2._M_current = ptVar5;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    iVar4 = var_BLOCK(local_f0);
    iVar4 = iVar4 + 3;
  }
  iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
  if (iVar3 == 0) {
    ptVar5 = (treeNode *)operator_new(0x38);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,anon_var_dwarf_7ca6,anon_var_dwarf_7ca6 + 0x12);
    treeNode::treeNode(ptVar5,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f0 = ptVar5;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_f0);
    }
    else {
      *iVar2._M_current = ptVar5;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    procedure_BLOCK(local_f0);
  }
  ptVar5 = (treeNode *)operator_new(0x38);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,anon_var_dwarf_7d4c + 6,anon_var_dwarf_7d4c + 0xc);
  treeNode::treeNode(ptVar5,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  iVar2._M_current =
       (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f0 = ptVar5;
  if (iVar2._M_current ==
      (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
              ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_f0);
  }
  else {
    *iVar2._M_current = ptVar5;
    ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"int","");
  addCode(&local_e8,0,iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  codes.super__Vector_base<codeEle,_std::allocator<codeEle>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar6 + -1].offset = cx + -1;
  sen_BLOCK(local_f0);
  return;
}

Assistant:

void subBlock(treeNode* tn)
{
    addCode("jmp",0,-1);        //跳转到语句部分
    int tmpCodeAddr = cx - 1;
    int varcount = 0;
    if (sym == "const") {
        auto *const_BLOCKt = new treeNode("常量说明部分");
        tn->child.push_back(const_BLOCKt);
        const_BLOCK(const_BLOCKt);              //常量说明
    }
    if (sym == "var") {
        auto *var_BLOCKt = new treeNode("变量说明部分");
        tn->child.push_back(var_BLOCKt);
        varcount = var_BLOCK(var_BLOCKt);                //变量说明
    }
    if (sym == "procedure") {
        auto *procedure_BLOCKt = new treeNode("过程说明部分");
        tn->child.push_back(procedure_BLOCKt);
        procedure_BLOCK(procedure_BLOCKt);          //过程说明
    }
    auto *sen_BLOCKt = new treeNode("语句");
    tn->child.push_back(sen_BLOCKt);
    //添加代码
    addCode("int",0,varcount+3);
    codes[tmpCodeAddr].offset = cx - 1;
    //
    sen_BLOCK(sen_BLOCKt);                //语句
}